

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Salsa20.c
# Opt level: O2

void Hacl_Salsa20_hsalsa20(uint8_t *output,uint8_t *key,uint8_t *nonce)

{
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint32_t local_98;
  undefined8 local_94;
  undefined8 uStack_8c;
  undefined4 local_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined4 local_5c;
  uint32_t local_58 [4];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  Hacl_Lib_LoadStore32_uint32s_from_le_bytes((uint32_t *)&local_c8,key,8);
  Hacl_Lib_LoadStore32_uint32s_from_le_bytes((uint32_t *)&local_a8,nonce,4);
  local_98 = 0x61707865;
  local_94 = local_c8;
  uStack_8c = uStack_c0;
  local_84 = 0x3320646e;
  local_80 = local_a8;
  uStack_78 = uStack_a0;
  local_70 = 0x79622d32;
  local_6c = local_b8;
  uStack_64 = uStack_b0;
  local_5c = 0x6b206574;
  Hacl_Impl_Salsa20_rounds(&local_98);
  local_58[1] = local_84;
  local_58[0] = local_98;
  local_58[3] = local_5c;
  local_58[2] = local_70;
  local_48 = local_80;
  uStack_40 = uStack_78;
  Hacl_Lib_LoadStore32_uint32s_to_le_bytes(output,local_58,8);
  return;
}

Assistant:

void Hacl_Salsa20_hsalsa20(uint8_t *output, uint8_t *key, uint8_t *nonce)
{
  Hacl_Impl_HSalsa20_crypto_core_hsalsa20(output, nonce, key);
}